

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O2

void __thiscall cmCTestScriptHandler::~cmCTestScriptHandler(cmCTestScriptHandler *this)

{
  cmake *this_00;
  
  (this->super_cmCTestGenericHandler).super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCTestScriptHandler_00669d18;
  this->Makefile = (cmMakefile *)0x0;
  if (this->LocalGenerator != (cmLocalGenerator *)0x0) {
    (*this->LocalGenerator->_vptr_cmLocalGenerator[1])();
  }
  this->LocalGenerator = (cmLocalGenerator *)0x0;
  if (this->GlobalGenerator != (cmGlobalGenerator *)0x0) {
    (*this->GlobalGenerator->_vptr_cmGlobalGenerator[1])();
  }
  this->GlobalGenerator = (cmGlobalGenerator *)0x0;
  this_00 = this->CMake;
  if (this_00 != (cmake *)0x0) {
    cmake::~cmake(this_00);
    operator_delete(this_00,0x260);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->ExtraUpdates);
  std::__cxx11::string::~string((string *)&this->CMOutFile);
  std::__cxx11::string::~string((string *)&this->CMakeCmd);
  std::__cxx11::string::~string((string *)&this->InitialCache);
  std::__cxx11::string::~string((string *)&this->CTestEnv);
  std::__cxx11::string::~string((string *)&this->UpdateCmd);
  std::__cxx11::string::~string((string *)&this->CTestCmd);
  std::__cxx11::string::~string((string *)&this->CVSCheckOut);
  std::__cxx11::string::~string((string *)&this->CTestRoot);
  std::__cxx11::string::~string((string *)&this->BackupBinaryDir);
  std::__cxx11::string::~string((string *)&this->BackupSourceDir);
  std::__cxx11::string::~string((string *)&this->BinaryDir);
  std::__cxx11::string::~string((string *)&this->SourceDir);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&(this->ScriptProcessScope).super__Bvector_base<std::allocator<bool>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->ConfigurationScripts);
  cmCTestGenericHandler::~cmCTestGenericHandler(&this->super_cmCTestGenericHandler);
  return;
}

Assistant:

cmCTestScriptHandler::~cmCTestScriptHandler()
{
  // local generator owns the makefile
  this->Makefile = 0;
  if (this->LocalGenerator)
    {
    delete this->LocalGenerator;
    }
  this->LocalGenerator = 0;
  if (this->GlobalGenerator)
    {
    delete this->GlobalGenerator;
    }
  this->GlobalGenerator = 0;
  if (this->CMake)
    {
    delete this->CMake;
    }
}